

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

Data * __thiscall QTzTimeZonePrivate::data(QTzTimeZonePrivate *this,qint64 forMSecsSinceEpoch)

{
  anon_class_8_1_026a51d3 __pred;
  anon_class_8_1_026a51d3 __pred_00;
  QTzTransitionRule rule;
  QTzTransitionRule rule_00;
  bool bVar1;
  QTzTransitionTime *pQVar2;
  const_iterator cVar3;
  const_iterator o;
  const_reference pQVar4;
  long in_RDX;
  QTzTimeZonePrivate *in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  Data *data;
  const_iterator last;
  const_iterator it;
  QList<QTimeZonePrivate::Data> posixTrans;
  Data *in_stack_fffffffffffffe98;
  Data *in_stack_fffffffffffffea0;
  QList<QTzTransitionTime> *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  const_iterator in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  const_iterator in_stack_fffffffffffffed8;
  const_iterator in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff0c;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x74ce6b);
  if (!bVar1) {
    tranCache(in_RSI);
    bVar1 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74ce85);
    if (!bVar1) {
      tranCache(in_RSI);
      pQVar2 = QList<QTzTransitionTime>::last(in_stack_fffffffffffffea8);
      if (in_RDX <= pQVar2->atMSecsSinceEpoch) goto LAB_0074d144;
    }
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffed8.i = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffee0.i = (QTzTransitionTime *)local_38;
    getPosixTransitions((QTzTimeZonePrivate *)
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),(qint64)in_RSI
                       );
    local_40.i = (Data *)in_stack_fffffffffffffed8.i;
    QList<QTimeZonePrivate::Data>::cbegin
              ((QList<QTimeZonePrivate::Data> *)in_stack_fffffffffffffea0);
    QList<QTimeZonePrivate::Data>::cend((QList<QTimeZonePrivate::Data> *)in_stack_fffffffffffffea0);
    cVar3.i._7_1_ = in_stack_fffffffffffffed7;
    cVar3.i._0_7_ = in_stack_fffffffffffffed0;
    __pred.forMSecsSinceEpoch._6_1_ = in_stack_fffffffffffffec6;
    __pred.forMSecsSinceEpoch._0_6_ = in_stack_fffffffffffffec0;
    __pred.forMSecsSinceEpoch._7_1_ = in_stack_fffffffffffffec7;
    local_40 = std::
               partition_point<QList<QTimeZonePrivate::Data>::const_iterator,QTzTimeZonePrivate::data(long_long)const::__0>
                         (cVar3,in_stack_fffffffffffffec8,__pred);
    cVar3 = QList<QTimeZonePrivate::Data>::cbegin(in_stack_fffffffffffffea0);
    in_stack_fffffffffffffed7 =
         QList<QTimeZonePrivate::Data>::const_iterator::operator>(&local_40,cVar3);
    if ((bool)in_stack_fffffffffffffed7) {
LAB_0074cffe:
      *(undefined1 **)&in_RDI->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&in_RDI->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      in_RDI->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      cVar3 = QList<QTimeZonePrivate::Data>::cbegin(in_stack_fffffffffffffea0);
      in_stack_fffffffffffffec6 =
           QList<QTimeZonePrivate::Data>::const_iterator::operator>(&local_40,cVar3);
      if ((bool)in_stack_fffffffffffffec6) {
        local_48 = QList<QTimeZonePrivate::Data>::const_iterator::operator-
                             (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      else {
        local_48.i = local_40.i;
      }
      QList<QTimeZonePrivate::Data>::const_iterator::operator*(&local_48);
      QTimeZonePrivate::Data::Data(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_RDI->atMSecsSinceEpoch = in_RDX;
      bVar1 = true;
    }
    else {
      in_stack_fffffffffffffec8.i = (Data *)tranCache(in_RSI);
      bVar1 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74cfb8);
      if (bVar1) {
        cVar3 = QList<QTimeZonePrivate::Data>::cend(in_stack_fffffffffffffea0);
        in_stack_fffffffffffffec7 =
             QList<QTimeZonePrivate::Data>::const_iterator::operator<(&local_40,cVar3);
        if ((bool)in_stack_fffffffffffffec7) goto LAB_0074cffe;
      }
      bVar1 = false;
    }
    QList<QTimeZonePrivate::Data>::~QList((QList<QTimeZonePrivate::Data> *)0x74d130);
    if (bVar1) goto LAB_0074d308;
  }
LAB_0074d144:
  tranCache(in_RSI);
  bVar1 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74d156);
  if (bVar1) {
    QTimeZonePrivate::Data::Data(in_stack_fffffffffffffea0);
  }
  else {
    local_50.i = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    tranCache(in_RSI);
    QList<QTzTransitionTime>::cbegin((QList<QTzTransitionTime> *)in_stack_fffffffffffffea0);
    tranCache(in_RSI);
    QList<QTzTransitionTime>::cend((QList<QTzTransitionTime> *)in_stack_fffffffffffffea0);
    __pred_00.forMSecsSinceEpoch._7_1_ = in_stack_fffffffffffffed7;
    __pred_00.forMSecsSinceEpoch._0_7_ = in_stack_fffffffffffffed0;
    local_50 = std::
               partition_point<QList<QTzTransitionTime>::const_iterator,QTzTimeZonePrivate::data(long_long)const::__1>
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,__pred_00);
    tranCache(in_RSI);
    o = QList<QTzTransitionTime>::cbegin((QList<QTzTransitionTime> *)in_stack_fffffffffffffea0);
    uVar5 = SUB84(o.i,0);
    bVar1 = QList<QTzTransitionTime>::const_iterator::operator==(&local_50,o);
    if (bVar1) {
      local_14._0_4_ = (in_RSI->cached_data).m_preZoneRule.stdOffset;
      local_14._4_4_ = (in_RSI->cached_data).m_preZoneRule.dstOffset;
      local_c = *(undefined4 *)&(in_RSI->cached_data).m_preZoneRule.abbreviationIndex;
      rule._8_4_ = uVar5;
      rule._0_8_ = in_RSI;
      dataFromRule((QTzTimeZonePrivate *)in_stack_fffffffffffffec8.i,rule,
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
    }
    else {
      QList<QTzTransitionTime>::const_iterator::operator--(&local_50);
      QList<QTzTransitionTime>::const_iterator::operator->(&local_50);
      pQVar4 = QList<QTzTransitionRule>::at
                         ((QList<QTzTransitionRule> *)in_stack_fffffffffffffea0,
                          (qsizetype)in_stack_fffffffffffffe98);
      local_20._0_4_ = pQVar4->stdOffset;
      local_20._4_4_ = pQVar4->dstOffset;
      local_18 = *(undefined4 *)&pQVar4->abbreviationIndex;
      rule_00._8_4_ = uVar5;
      rule_00._0_8_ = in_RSI;
      dataFromRule((QTzTimeZonePrivate *)in_stack_fffffffffffffec8.i,rule_00,
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
    }
  }
LAB_0074d308:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(qint64 forMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < forMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(forMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [forMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                       });
        // Use most recent, if any in the past; or the first if we have no other rules:
        if (it > posixTrans.cbegin() || (tranCache().isEmpty() && it < posixTrans.cend())) {
            Data data = *(it > posixTrans.cbegin() ? it - 1 : it);
            data.atMSecsSinceEpoch = forMSecsSinceEpoch;
            return data;
        }
    }
    if (tranCache().isEmpty()) // Only possible if !isValid()
        return {};

    // Otherwise, use the rule for the most recent or first transition:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [forMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                     });
    if (last == tranCache().cbegin())
        return dataFromRule(cached_data.m_preZoneRule, forMSecsSinceEpoch);

    --last;
    return dataFromRule(cached_data.m_tranRules.at(last->ruleIndex), forMSecsSinceEpoch);
}